

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_parse_linkname(archive_string *linkname,archive_string *pathname)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 *in_RSI;
  size_t in_RDI;
  size_t symlen;
  char *linkptr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pcVar1 = strchr((char *)*in_RSI,0x7c);
  if (pcVar1 != (char *)0x0) {
    strlen(pcVar1 + 1);
    *(undefined8 *)(in_RDI + 8) = 0;
    archive_strncat((archive_string *)symlen,
                    (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    *pcVar1 = '\0';
    sVar2 = strlen((char *)*in_RSI);
    in_RSI[1] = sVar2;
  }
  return (uint)(pcVar1 != (char *)0x0);
}

Assistant:

static int
lha_parse_linkname(struct archive_string *linkname,
    struct archive_string *pathname)
{
	char *	linkptr;
	size_t 	symlen;

	linkptr = strchr(pathname->s, '|');
	if (linkptr != NULL) {
		symlen = strlen(linkptr + 1);
		archive_strncpy(linkname, linkptr+1, symlen);

		*linkptr = 0;
		pathname->length = strlen(pathname->s);

		return (1);
	}
	return (0);
}